

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O3

void bcm2835_aux_spi_write(uint16_t data)

{
  uint32_t *puVar1;
  
  puVar1 = bcm2835_spi1;
  if (debug == '\0') {
    *bcm2835_spi1 = spi1_speed << 0x14 | 0x60850;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",bcm2835_spi1);
  }
  if (debug == '\0') {
    puVar1[1] = 2;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",puVar1 + 1,2);
  }
  do {
    if (debug != '\0') {
      printf("bcm2835_peri_read  paddr %p\n");
      break;
    }
  } while ((puVar1[2] >> 10 & 1) != 0);
  if (debug == '\0') {
    puVar1[8] = (uint)data << 0x10;
    return;
  }
  printf("bcm2835_peri_write paddr %p, value %08X\n",puVar1 + 8,(ulong)data << 0x10);
  return;
}

Assistant:

void bcm2835_aux_spi_write(uint16_t data)
{
    volatile uint32_t* cntl0 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL0/4;
    volatile uint32_t* cntl1 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL1/4;
    volatile uint32_t* stat = bcm2835_spi1 + BCM2835_AUX_SPI_STAT/4;
    volatile uint32_t* io = bcm2835_spi1 + BCM2835_AUX_SPI_IO/4;

    uint32_t _cntl0 = (spi1_speed << BCM2835_AUX_SPI_CNTL0_SPEED_SHIFT);
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_CS2_N;
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_ENABLE;
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_MSBF_OUT;
    _cntl0 |= 16; // Shift length

    bcm2835_peri_write(cntl0, _cntl0);
    bcm2835_peri_write(cntl1, BCM2835_AUX_SPI_CNTL1_MSBF_IN);

    while (bcm2835_peri_read(stat) & BCM2835_AUX_SPI_STAT_TX_FULL)
	;

    bcm2835_peri_write(io, (uint32_t) data << 16);
}